

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise.cpp
# Opt level: O0

int __thiscall ncnn::Eltwise::load_param(Eltwise *this,ParamDict *pd)

{
  int iVar1;
  Mat *in_RSI;
  long in_RDI;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  ParamDict *in_stack_ffffffffffffff68;
  
  iVar1 = ParamDict::get((ParamDict *)in_RSI,0,0);
  *(int *)(in_RDI + 0xd0) = iVar1;
  this_00 = (Mat *)&stack0xffffffffffffff60;
  ncnn::Mat::Mat(this_00);
  ParamDict::get(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff58);
  ncnn::Mat::operator=(this_00,in_RSI);
  ncnn::Mat::~Mat((Mat *)0x3b4288);
  ncnn::Mat::~Mat((Mat *)0x3b4292);
  return 0;
}

Assistant:

int Eltwise::load_param(const ParamDict& pd)
{
    op_type = pd.get(0, 0);
    coeffs = pd.get(1, Mat());

    return 0;
}